

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftlib.c
# Opt level: O0

void fft2pt(float *ioptr)

{
  float fVar1;
  float fVar2;
  float t0i;
  float t0r;
  float f1i;
  float f1r;
  float f0i;
  float f0r;
  float *ioptr_local;
  
  fVar1 = *ioptr;
  fVar2 = ioptr[1];
  *ioptr = fVar1 + ioptr[2];
  ioptr[1] = fVar2 + ioptr[3];
  ioptr[2] = fVar1 - ioptr[2];
  ioptr[3] = fVar2 - ioptr[3];
  return;
}

Assistant:

static inline void fft2pt(float *ioptr) {
/***   RADIX 2 fft	***/
float f0r, f0i, f1r, f1i;
float t0r, t0i;

	/* bit reversed load */
f0r = ioptr[0];
f0i = ioptr[1];
f1r = ioptr[2];
f1i = ioptr[3];

		/* Butterflys		*/
		/*
		f0	-	-	t0
		f1	-  1 -	f1
		*/

t0r = f0r + f1r;
t0i = f0i + f1i;
f1r = f0r - f1r;
f1i = f0i - f1i;

	/* store result */
ioptr[0] = t0r;
ioptr[1] = t0i;
ioptr[2] = f1r;
ioptr[3] = f1i;
}